

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O0

wstring * __thiscall JSONValue::StringifyImpl_abi_cxx11_(JSONValue *this,size_t indentDepth)

{
  bool bVar1;
  uint uVar2;
  JSONValue *in_RDX;
  undefined4 *in_RSI;
  wchar_t *pwVar3;
  wstring *in_RDI;
  const_iterator iter_1;
  const_iterator iter;
  wstringstream ss;
  wstring indentStr1;
  wstring indentStr;
  size_t indentDepth1;
  wstring *ret_string;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  *in_stack_fffffffffffffbc8;
  __normal_iterator<JSONValue_*const_*,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  *in_stack_fffffffffffffbd0;
  allocator *paVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffbd8;
  size_t in_stack_fffffffffffffc08;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__rhs;
  wstring *this_00;
  allocator local_3ca;
  byte local_3c9;
  wstring local_3c8 [32];
  wstring local_3a8 [32];
  iterator local_388;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_380;
  wstring local_378 [32];
  wstring local_358 [32];
  iterator local_338;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_330;
  iterator local_328;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
  local_320;
  byte local_312;
  allocator local_311;
  wstring local_310 [37];
  byte local_2eb;
  allocator local_2ea;
  byte local_2e9;
  wstring local_2e8 [32];
  wstring local_2c8 [32];
  JSONValue **local_2a8;
  wstring local_2a0 [32];
  JSONValue **local_280;
  JSONValue **local_278;
  __normal_iterator<JSONValue_*const_*,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
  local_270;
  byte local_262;
  allocator local_261;
  wstring local_260 [32];
  wstring local_240 [32];
  long local_220 [2];
  wostream local_210 [376];
  wstring local_98 [32];
  wstring local_78 [48];
  wstring local_48 [32];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  byte bVar6;
  
  uVar5 = 0;
  this_00 = in_RDI;
  std::__cxx11::wstring::wstring(in_RDI);
  if (in_RDX == (JSONValue *)0x0) {
    __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x0;
  }
  else {
    __rhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
            ((long)&in_RDX->type + 1);
  }
  local_28 = __rhs;
  Indent_abi_cxx11_(in_stack_fffffffffffffc08);
  Indent_abi_cxx11_(in_stack_fffffffffffffc08);
  switch(*in_RSI) {
  case 0:
    std::__cxx11::wstring::operator=(this_00,L"null");
    break;
  case 1:
    StringifyString((wstring *)this_00);
    std::__cxx11::wstring::operator=(this_00,local_98);
    std::__cxx11::wstring::~wstring(local_98);
    break;
  case 2:
    pwVar3 = L"false";
    if ((*(byte *)(in_RSI + 2) & 1) != 0) {
      pwVar3 = L"true";
    }
    std::__cxx11::wstring::operator=(this_00,pwVar3);
    break;
  case 3:
    uVar2 = std::isinf(*(double *)(in_RSI + 2));
    if (((uVar2 & 1) == 0) && (uVar2 = std::isnan(*(double *)(in_RSI + 2)), (uVar2 & 1) == 0)) {
      std::__cxx11::wstringstream::wstringstream((wstringstream *)local_220);
      std::ios_base::precision((ios_base *)((long)local_220 + *(long *)(local_220[0] + -0x18)),0xf);
      std::wostream::operator<<(local_210,*(double *)(in_RSI + 2));
      std::__cxx11::wstringstream::str();
      std::__cxx11::wstring::operator=(this_00,local_240);
      std::__cxx11::wstring::~wstring(local_240);
      std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_220);
    }
    else {
      std::__cxx11::wstring::operator=(this_00,L"null");
    }
    break;
  case 4:
    local_262 = 0;
    if (in_RDX == (JSONValue *)0x0) {
      std::allocator<wchar_t>::allocator();
      local_262 = 1;
      std::__cxx11::wstring::wstring(local_260,L"[",&local_261);
    }
    else {
      std::operator+((wchar_t *)this_00,__rhs);
    }
    std::__cxx11::wstring::operator=(this_00,local_260);
    std::__cxx11::wstring::~wstring(local_260);
    if ((local_262 & 1) != 0) {
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_261);
    }
    local_278 = (JSONValue **)
                std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::begin
                          ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                           in_stack_fffffffffffffbc8);
    __gnu_cxx::
    __normal_iterator<JSONValue*const*,std::vector<JSONValue*,std::allocator<JSONValue*>>>::
    __normal_iterator<JSONValue**>
              (in_stack_fffffffffffffbd0,
               (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                *)in_stack_fffffffffffffbc8);
    while( true ) {
      local_280 = (JSONValue **)
                  std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                            ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                             in_stack_fffffffffffffbc8);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffbd0,
                         (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          *)in_stack_fffffffffffffbc8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<JSONValue_*const_*,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
      ::operator*(&local_270);
      StringifyImpl_abi_cxx11_(in_RDX,CONCAT17(uVar5,in_stack_ffffffffffffffe0));
      std::__cxx11::wstring::operator+=(this_00,local_2a0);
      std::__cxx11::wstring::~wstring(local_2a0);
      __gnu_cxx::
      __normal_iterator<JSONValue_*const_*,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
      ::operator++(&local_270);
      local_2a8 = (JSONValue **)
                  std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::end
                            ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                             in_stack_fffffffffffffbc8);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffbd0,
                         (__normal_iterator<JSONValue_**,_std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>_>
                          *)in_stack_fffffffffffffbc8);
      if (bVar1) {
        std::__cxx11::wstring::operator+=(this_00,L",");
      }
    }
    local_2e9 = 0;
    local_2eb = 0;
    if (in_RDX == (JSONValue *)0x0) {
      std::allocator<wchar_t>::allocator();
      local_2eb = 1;
      std::__cxx11::wstring::wstring(local_2c8,L"]",&local_2ea);
    }
    else {
      std::operator+((wchar_t *)this_00,__rhs);
      local_2e9 = 1;
      std::operator+(in_stack_fffffffffffffbd8,(wchar_t *)in_stack_fffffffffffffbd0);
    }
    std::__cxx11::wstring::operator+=(this_00,local_2c8);
    std::__cxx11::wstring::~wstring(local_2c8);
    if ((local_2eb & 1) != 0) {
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_2ea);
    }
    if ((local_2e9 & 1) != 0) {
      std::__cxx11::wstring::~wstring(local_2e8);
    }
    break;
  case 5:
    local_312 = 0;
    if (in_RDX == (JSONValue *)0x0) {
      std::allocator<wchar_t>::allocator();
      local_312 = 1;
      std::__cxx11::wstring::wstring(local_310,L"{",&local_311);
    }
    else {
      std::operator+((wchar_t *)this_00,__rhs);
    }
    std::__cxx11::wstring::operator=(this_00,local_310);
    std::__cxx11::wstring::~wstring(local_310);
    if ((local_312 & 1) != 0) {
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_311);
    }
    local_328._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
         ::begin(in_stack_fffffffffffffbc8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
    ::_Rb_tree_const_iterator(&local_320,&local_328);
    while( true ) {
      local_338._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
           ::end(in_stack_fffffffffffffbc8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
      ::_Rb_tree_const_iterator(&local_330,&local_338);
      bVar1 = std::operator!=(&local_320,&local_330);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                   *)0x25bbbe);
      StringifyString((wstring *)this_00);
      std::__cxx11::wstring::operator+=(this_00,local_358);
      std::__cxx11::wstring::~wstring(local_358);
      std::__cxx11::wstring::operator+=(this_00,L":");
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
      ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                   *)0x25bc11);
      StringifyImpl_abi_cxx11_(in_RDX,CONCAT17(uVar5,in_stack_ffffffffffffffe0));
      std::__cxx11::wstring::operator+=(this_00,local_378);
      std::__cxx11::wstring::~wstring(local_378);
      in_stack_fffffffffffffbd8 =
           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
           ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
                         *)in_stack_fffffffffffffbd0);
      local_388._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
           ::end(in_stack_fffffffffffffbc8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>
      ::_Rb_tree_const_iterator(&local_380,&local_388);
      bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffbd8,&local_380);
      if (bVar1) {
        std::__cxx11::wstring::operator+=(this_00,L",");
      }
    }
    local_3c9 = 0;
    if (in_RDX == (JSONValue *)0x0) {
      paVar4 = &local_3ca;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring(local_3a8,L"}",paVar4);
    }
    else {
      std::operator+((wchar_t *)this_00,__rhs);
      local_3c9 = 1;
      std::operator+(in_stack_fffffffffffffbd8,(wchar_t *)in_stack_fffffffffffffbd0);
    }
    std::__cxx11::wstring::operator+=(this_00,local_3a8);
    std::__cxx11::wstring::~wstring(local_3a8);
    if (in_RDX == (JSONValue *)0x0) {
      std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_3ca);
    }
    if ((local_3c9 & 1) != 0) {
      std::__cxx11::wstring::~wstring(local_3c8);
    }
  }
  bVar6 = 1;
  std::__cxx11::wstring::~wstring(local_78);
  std::__cxx11::wstring::~wstring(local_48);
  if ((bVar6 & 1) == 0) {
    std::__cxx11::wstring::~wstring(this_00);
  }
  return in_RDI;
}

Assistant:

std::wstring JSONValue::StringifyImpl(size_t const indentDepth) const
{
	std::wstring ret_string;
	size_t const indentDepth1 = indentDepth ? indentDepth + 1 : 0;
	std::wstring const indentStr = Indent(indentDepth);
	std::wstring const indentStr1 = Indent(indentDepth1);

	switch (type)
	{
		case JSONType_Null:
			ret_string = L"null";
			break;

		case JSONType_String:
			ret_string = StringifyString(*string_value);
			break;

		case JSONType_Bool:
			ret_string = bool_value ? L"true" : L"false";
			break;

		case JSONType_Number:
		{
			if (isinf(number_value) || isnan(number_value))
				ret_string = L"null";
			else
			{
				std::wstringstream ss;
				ss.precision(15);
				ss << number_value;
				ret_string = ss.str();
			}
			break;
		}

		case JSONType_Array:
		{
			ret_string = indentDepth ? L"[\n" + indentStr1 : L"[";
			JSONArray::const_iterator iter = array_value->begin();
			while (iter != array_value->end())
			{
				ret_string += (*iter)->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != array_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"]" : L"]";
			break;
		}

		case JSONType_Object:
		{
			ret_string = indentDepth ? L"{\n" + indentStr1 : L"{";
			JSONObject::const_iterator iter = object_value->begin();
			while (iter != object_value->end())
			{
				ret_string += StringifyString((*iter).first);
				ret_string += L":";
				ret_string += (*iter).second->StringifyImpl(indentDepth1);

				// Not at the end - add a separator
				if (++iter != object_value->end())
					ret_string += L",";
			}
			ret_string += indentDepth ? L"\n" + indentStr + L"}" : L"}";
			break;
		}
	}

	return ret_string;
}